

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O2

Instruction * __thiscall spvtools::opt::BasicBlock::GetMergeInst(BasicBlock *this)

{
  Instruction *pIVar1;
  Function *in_RAX;
  Instruction *pIVar2;
  Function *local_18;
  
  local_18 = in_RAX;
  ctail((BasicBlock *)&stack0xffffffffffffffe8);
  if (local_18 ==
      (Function *)
      (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_) {
    pIVar2 = (Instruction *)0x0;
  }
  else {
    pIVar1 = (Instruction *)
             (local_18->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pIVar2 = (Instruction *)0x0;
    if ((pIVar1->opcode_ & ~OpUndef) == OpLoopMerge) {
      pIVar2 = pIVar1;
    }
  }
  return pIVar2;
}

Assistant:

const Instruction* BasicBlock::GetMergeInst() const {
  const Instruction* result = nullptr;
  // If it exists, the merge instruction immediately precedes the
  // terminator.
  auto iter = ctail();
  if (iter != cbegin()) {
    --iter;
    const auto opcode = iter->opcode();
    if (opcode == spv::Op::OpLoopMerge || opcode == spv::Op::OpSelectionMerge) {
      result = &*iter;
    }
  }
  return result;
}